

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O2

callback_t *
state_include(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char t;
  QDebug *pQVar1;
  initializer_list<char> __l;
  initializer_list<char> __l_00;
  allocator_type aaStack_b8 [8];
  MetaInclude include;
  string include_name;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  undefined8 local_50;
  string local_48;
  
  include_name._M_dataplus._M_p._0_2_ = 0x223c;
  __l._M_len = 2;
  __l._M_array = (iterator)&include_name;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&include,__l,(allocator_type *)&local_68);
  read_untill_delimiters_abi_cxx11_(&local_48,f,(vector<char,_std::allocator<char>_> *)&include);
  std::__cxx11::string::~string((string *)&local_48);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&include);
  t = std::istream::get();
  include.name._M_dataplus._M_p._0_4_ = 2;
  include.name.field_2._M_allocated_capacity._4_4_ = 0;
  include.name._4_8_ = 0;
  include.name._12_8_ = 0;
  include.name.field_2._8_8_ = anon_var_dwarf_521b;
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<((QDebug *)&include_name,"Delimiter");
  QDebug::operator<<(pQVar1,t);
  QDebug::~QDebug((QDebug *)&include_name);
  local_68 = CONCAT22(local_68._2_2_,0x223e);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_68;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&include,__l_00,aaStack_b8);
  read_untill_delimiters_abi_cxx11_(&include_name,f,(vector<char,_std::allocator<char>_> *)&include)
  ;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&include);
  std::istream::ignore();
  std::__cxx11::string::string((string *)&include,(string *)&include_name);
  include.is_global = t == '<';
  std::vector<MetaInclude,_std::allocator<MetaInclude>_>::push_back(&conf->includes,&include);
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = parser()::category._8_8_;
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<((QDebug *)aaStack_b8,"include added: ");
    operator<<(pQVar1,&include_name);
    QDebug::~QDebug((QDebug *)aaStack_b8);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = initial_state;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  std::__cxx11::string::~string((string *)&include);
  std::__cxx11::string::~string((string *)&include_name);
  return __return_storage_ptr__;
}

Assistant:

callback_t state_include(MetaConfiguration &conf, std::ifstream &f, int &error) {
  read_untill_delimiters(f, {'<', '"'});

  char start_delimiter = f.get();
  qDebug() << "Delimiter" << start_delimiter;
  std::string include_name = read_untill_delimiters(f, {'>', '"'});
  f.ignore(); // ignore the end delimiter.

  MetaInclude include {
    include_name,
    start_delimiter == '<'
  };

  conf.includes.push_back(include);
  qCDebug(parser) << "include added: " << include_name;
  return initial_state;
}